

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O0

void yajl_tree_free(yajl_val v)

{
  int *in_RDI;
  size_t local_18;
  yajl_val in_stack_fffffffffffffff0;
  void *__s;
  
  if (in_RDI != (int *)0x0) {
    if ((in_RDI == (int *)0x0) || (*in_RDI != 1)) {
      if ((in_RDI == (int *)0x0) || (*in_RDI != 2)) {
        if ((in_RDI == (int *)0x0) || ((*in_RDI != 3 || (in_RDI == (int *)0xfffffffffffffff8)))) {
          if ((in_RDI == (int *)0x0) || ((*in_RDI != 4 || (in_RDI == (int *)0xfffffffffffffff8)))) {
            free(in_RDI);
          }
          else {
            yajl_array_free(in_stack_fffffffffffffff0);
          }
        }
        else {
          yajl_object_free(in_stack_fffffffffffffff0);
        }
      }
      else {
        free(*(void **)(in_RDI + 6));
        free(in_RDI);
      }
    }
    else {
      __s = *(void **)(in_RDI + 2);
      if (*(long *)(in_RDI + 2) == 0) {
        local_18 = 0;
      }
      else {
        local_18 = strlen(*(char **)(in_RDI + 2));
      }
      memset(__s,0,local_18);
      free(*(void **)(in_RDI + 2));
      free(in_RDI);
    }
  }
  return;
}

Assistant:

void yajl_tree_free (yajl_val v)
{
    if (v == NULL) return;

    if (YAJL_IS_STRING(v))
    {
        memset(v->u.string, 0, strlens(v->u.string));
        free(v->u.string);
        free(v);
    }
    else if (YAJL_IS_NUMBER(v))
    {
        free(v->u.number.r);
        free(v);
    }
    else if (YAJL_GET_OBJECT(v))
    {
        yajl_object_free(v);
    }
    else if (YAJL_GET_ARRAY(v))
    {
        yajl_array_free(v);
    }
    else /* if (yajl_t_true or yajl_t_false or yajl_t_null) */
    {
        free(v);
    }
}